

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  ostream *os;
  int *piVar3;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  String local_b8;
  int local_a4;
  undefined1 local_a0 [4];
  int gtest_retval_1;
  int local_8c;
  undefined1 local_88 [4];
  int gtest_retval;
  int local_74;
  undefined1 local_70 [4];
  pid_t child_pid;
  String local_60;
  int local_50;
  int local_4c;
  int pipe_fd [2];
  GTestLog local_24;
  size_t local_20;
  size_t thread_count;
  NoExecDeathTest *this_local;
  
  thread_count = (size_t)this;
  local_20 = GetThreadCount();
  if (local_20 != 1) {
    GTestLog::GTestLog(&local_24,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/foreign/gtest/src/gtest-death-test.cc"
                       ,0x315);
    os = GTestLog::GetStream(&local_24);
    DeathTestThreadWarning((internal *)pipe_fd,local_20);
    internal::operator<<(os,(String *)pipe_fd);
    String::~String((String *)pipe_fd);
    GTestLog::~GTestLog(&local_24);
  }
  do {
    iVar2 = pipe(&local_50);
    bVar1 = IsTrue(iVar2 != -1);
    if (!bVar1) {
      String::Format(&local_60,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/foreign/gtest/src/gtest-death-test.cc"
                     ,0x319,"pipe(pipe_fd) != -1");
      DeathTestAbort(&local_60);
      String::~String(&local_60);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  String::String((String *)local_70,"");
  DeathTest::set_last_death_test_message((String *)local_70);
  String::~String((String *)local_70);
  CaptureStderr();
  FlushInfoLog();
  local_74 = fork();
  do {
    bVar1 = IsTrue(local_74 != -1);
    if (!bVar1) {
      String::Format((String *)local_88,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/foreign/gtest/src/gtest-death-test.cc"
                     ,0x327,"child_pid != -1");
      DeathTestAbort((String *)local_88);
      String::~String((String *)local_88);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  ForkingDeathTest::set_child_pid(&this->super_ForkingDeathTest,local_74);
  if (local_74 == 0) {
    do {
      do {
        local_8c = close(local_50);
        bVar1 = false;
        if (local_8c == -1) {
          piVar3 = __errno_location();
          bVar1 = *piVar3 == 4;
        }
      } while (bVar1);
      if (local_8c == -1) {
        String::Format((String *)local_a0,"CHECK failed: File %s, line %d: %s != -1",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/foreign/gtest/src/gtest-death-test.cc"
                       ,0x32a,"close(pipe_fd[0])");
        DeathTestAbort((String *)local_a0);
        String::~String((String *)local_a0);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_write_fd((DeathTestImpl *)this,local_4c);
    LogToStderr();
    this_00 = GetUnitTestImpl();
    this_01 = UnitTestImpl::listeners(this_00);
    TestEventListeners::SuppressEventForwarding(this_01);
    this_local._4_4_ = EXECUTE_TEST;
  }
  else {
    do {
      do {
        local_a4 = close(local_4c);
        bVar1 = false;
        if (local_a4 == -1) {
          piVar3 = __errno_location();
          bVar1 = *piVar3 == 4;
        }
      } while (bVar1);
      if (local_a4 == -1) {
        String::Format(&local_b8,"CHECK failed: File %s, line %d: %s != -1",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/foreign/gtest/src/gtest-death-test.cc"
                       ,0x335,"close(pipe_fd[1])");
        DeathTestAbort(&local_b8);
        String::~String(&local_b8);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_read_fd((DeathTestImpl *)this,local_50);
    DeathTestImpl::set_spawned((DeathTestImpl *)this,true);
    this_local._4_4_ = OVERSEE_TEST;
  }
  return this_local._4_4_;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}